

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O1

bool pstore::index::details::internal_node::validate_after_load
               (internal_node *internal,typed_address<pstore::index::details::internal_node> addr)

{
  signature_type sVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  internal_node *piVar5;
  internal_node *piVar6;
  internal_node *piVar7;
  
  if (*(long *)(internal->signature_)._M_elems != 0x6c616e7265746e49) {
    return false;
  }
  piVar7 = (internal_node *)internal->children_;
  uVar3 = size(internal);
  piVar5 = (internal_node *)(internal->children_ + uVar3);
  if (3 < uVar3) {
    piVar7 = (internal_node *)((long)piVar7 + (ulong)(uVar3 & 0xfffffffc) * 8);
    lVar4 = (ulong)(uVar3 >> 2) + 1;
    piVar6 = (internal_node *)internal[1].children_;
    do {
      if (((*(ulong *)&piVar6[0xffffffffffffffff].signature_ & 2) != 0) ||
         ((ulong)addr.a_.a_ <=
          (*(ulong *)&piVar6[0xffffffffffffffff].signature_ & 0xfffffffffffffffe))) {
        piVar6 = piVar6 + 0xffffffffffffffff;
        goto LAB_00112ff0;
      }
      uVar2 = *(ulong *)&((internal_node *)((long)(piVar6 + 0xffffffffffffffff) + 8))->signature_;
      if (((uVar2 & 2) != 0) || ((ulong)addr.a_.a_ <= (uVar2 & 0xfffffffffffffffe))) {
        piVar6 = (internal_node *)((long)(piVar6 + 0xffffffffffffffff) + 8);
        goto LAB_00112ff0;
      }
      if ((((ulong)((index_pointer *)((long)(piVar6 + 0xffffffffffffffff) + 0x10))->internal_ & 2)
           != 0) ||
         ((ulong)addr.a_.a_ <=
          ((ulong)((index_pointer *)((long)(piVar6 + 0xffffffffffffffff) + 0x10))->internal_ &
          0xfffffffffffffffe))) {
        piVar6 = (internal_node *)((long)(piVar6 + 0xffffffffffffffff) + 0x10);
        goto LAB_00112ff0;
      }
      sVar1._M_elems = *&(piVar6->signature_)._M_elems;
      if ((((ulong)sVar1._M_elems & 2) != 0) ||
         ((ulong)addr.a_.a_ <= ((ulong)sVar1._M_elems & 0xfffffffffffffffe))) goto LAB_00112ff0;
      lVar4 = lVar4 + -1;
      piVar6 = (internal_node *)((long)(piVar6 + 1) + 8);
    } while (1 < lVar4);
  }
  lVar4 = (long)piVar5 - (long)piVar7 >> 3;
  if (lVar4 != 1) {
    piVar6 = piVar7;
    if (lVar4 != 2) {
      piVar6 = piVar5;
      if ((lVar4 != 3) ||
         (sVar1._M_elems = *&(piVar7->signature_)._M_elems, piVar6 = piVar7,
         (ulong)addr.a_.a_ <= ((ulong)sVar1._M_elems & 0xfffffffffffffffe) ||
         (char)((sVar1._M_elems._0_4_ & 2) >> 1) != '\0')) goto LAB_00112ff0;
      piVar6 = (internal_node *)&piVar7->bitmap_;
    }
    sVar1._M_elems = *&(piVar6->signature_)._M_elems;
    if ((ulong)addr.a_.a_ <= ((ulong)sVar1._M_elems & 0xfffffffffffffffe) ||
        (char)((sVar1._M_elems._0_4_ & 2) >> 1) != '\0') goto LAB_00112ff0;
    piVar7 = (internal_node *)&piVar6->bitmap_;
  }
  sVar1._M_elems = *&(piVar7->signature_)._M_elems;
  piVar6 = piVar7;
  if (((ulong)sVar1._M_elems & 0xfffffffffffffffe) < (ulong)addr.a_.a_ &&
      (char)((sVar1._M_elems._0_4_ & 2) >> 1) == '\0') {
    piVar6 = piVar5;
  }
LAB_00112ff0:
  return piVar6 == piVar5;
}

Assistant:

bool internal_node::validate_after_load (internal_node const & internal,
                                                     typed_address<internal_node> const addr) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (internal.signature_ != node_signature_) {
                    return false;
                }
#endif
                return std::all_of (std::begin (internal), std::end (internal),
                                    [addr] (index_pointer const & child) {
                                        if (child.is_heap () ||
                                            child.untag_address<internal_node> () >= addr) {
                                            return false;
                                        }
                                        return true;
                                    });
            }